

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O0

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Allocator *pAVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  Mat *in_RDX;
  Mat *in_RSI;
  void *__ptr;
  bool bVar9;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat borderm_1;
  Mat m_5;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  size_t out_elemsize_3;
  int out_elempack_3;
  Mat borderm;
  Mat m_1;
  int q;
  Mat bottom_blob_sliced;
  size_t out_elemsize_2;
  int out_elempack_2;
  size_t out_elemsize_1;
  int out_elempack_1;
  size_t out_elemsize;
  int out_elempack;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_4;
  Mat *m;
  Mat *m_6;
  Mat *m_2;
  Mat *m_7;
  Mat *m_3;
  undefined1 *_elemsize;
  Allocator *_allocator;
  int in_stack_ffffffffffffef88;
  int in_stack_ffffffffffffef8c;
  Mat *in_stack_ffffffffffffef90;
  Mat *pMVar10;
  int in_stack_ffffffffffffef98;
  int in_stack_ffffffffffffef9c;
  undefined4 in_stack_ffffffffffffefa0;
  int in_stack_ffffffffffffefa4;
  int in_stack_ffffffffffffeff0;
  Allocator *in_stack_ffffffffffffeff8;
  Allocator *in_stack_fffffffffffff000;
  int *in_stack_fffffffffffff060;
  undefined7 in_stack_fffffffffffff068;
  undefined1 in_stack_fffffffffffff06f;
  int *in_stack_fffffffffffff070;
  undefined7 in_stack_fffffffffffff078;
  undefined1 in_stack_fffffffffffff07f;
  Mat *in_stack_fffffffffffff080;
  Crop *in_stack_fffffffffffff088;
  Mat *pMVar11;
  int *in_stack_fffffffffffff0d0;
  undefined8 *puVar12;
  int *in_stack_fffffffffffff0d8;
  int *in_stack_fffffffffffff0e0;
  int *in_stack_fffffffffffff0e8;
  Mat local_d80;
  undefined8 local_d38;
  undefined8 local_d30;
  undefined8 local_d28;
  undefined4 local_d20;
  Allocator *local_d18;
  undefined4 local_d10;
  undefined4 local_d0c;
  undefined4 local_d08;
  undefined4 local_d04;
  undefined4 local_d00;
  undefined8 local_cf8;
  Mat local_cf0;
  undefined8 local_ca8;
  undefined8 local_ca0;
  undefined8 local_c98;
  undefined4 local_c90;
  Allocator *local_c88;
  undefined4 local_c80;
  undefined4 local_c7c;
  undefined4 local_c78;
  undefined4 local_c74;
  undefined4 local_c70;
  undefined8 local_c68;
  Mat local_c60;
  int local_c18;
  int local_c14;
  Mat local_c10;
  void *local_bc8;
  int *local_bc0;
  ulong local_bb8;
  int local_bb0;
  Allocator *local_ba8;
  int local_ba0;
  int local_b9c;
  int local_b98;
  uint local_b94;
  int local_b90;
  ulong local_b88;
  long local_b80;
  int local_b74;
  Mat local_b70;
  Mat local_b28;
  int local_ae0;
  undefined4 local_adc;
  void *local_ad8;
  int *local_ad0;
  size_t local_ac8;
  int local_ac0;
  Allocator *local_ab8;
  int local_ab0;
  int local_aac;
  int local_aa8;
  int local_aa4;
  int local_aa0;
  Option *in_stack_fffffffffffff568;
  Mat *in_stack_fffffffffffff570;
  Mat *in_stack_fffffffffffff578;
  int *piVar13;
  Crop *in_stack_fffffffffffff580;
  ulong uVar14;
  void *local_a10;
  int *local_a08;
  undefined8 local_a00;
  undefined4 local_9f8;
  long *local_9f0;
  undefined4 local_9e8;
  int local_9e4;
  int local_9e0;
  int local_9dc;
  int local_9d8;
  ulong local_9d0;
  Allocator local_9c4;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  size_t local_9a0;
  int local_994;
  int local_990;
  int local_98c;
  int local_988;
  int local_984;
  Mat *local_978;
  Mat *local_970;
  int local_95c;
  void **local_950;
  void **local_948;
  void **local_938;
  Mat *local_928;
  Mat *local_918;
  undefined8 *local_908;
  Mat *local_8f8;
  undefined8 *local_8e8;
  undefined8 *local_8d8;
  Mat *local_8c8;
  Mat *local_8b8;
  void **local_8a8;
  Mat *local_898;
  int local_888;
  undefined4 local_884;
  Mat *local_880;
  Mat *local_878;
  int local_868;
  undefined4 local_864;
  Mat *local_860;
  Mat *local_858;
  int local_848;
  undefined4 local_844;
  Mat *local_840;
  Mat *local_838;
  int local_828;
  undefined4 local_824;
  Mat *local_820;
  Mat *local_818;
  int local_808;
  undefined4 local_804;
  Mat *local_800;
  Mat *local_7f8;
  int local_7e8;
  undefined4 local_7e4;
  Mat *local_7e0;
  Mat *local_7d8;
  Mat *local_7c8;
  Mat *local_7c0;
  Mat *local_7b8;
  Mat *local_7b0;
  Mat *local_7a8;
  Mat *local_7a0;
  undefined1 local_791;
  int local_790;
  int local_78c;
  void **local_780;
  undefined1 local_769;
  int local_768;
  int local_764;
  undefined1 *local_758;
  undefined1 local_745;
  int local_744;
  void **local_740;
  undefined8 *local_738;
  undefined1 local_725;
  int local_724;
  undefined1 *local_720;
  Mat *local_718;
  undefined1 local_705;
  int local_704;
  undefined8 *local_6f8;
  undefined1 local_6e5;
  int local_6e4;
  Mat *local_6d8;
  int local_6c4;
  undefined8 *local_6c0;
  Mat *local_6b8;
  int local_6ac;
  undefined8 *local_6a8;
  Mat *local_6a0;
  Mat *local_698;
  Mat *local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  int local_66c;
  void **local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 local_650;
  int local_648;
  int local_644;
  void **local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  int local_61c;
  int local_618;
  int local_614;
  void **local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  int local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  void **local_5e0;
  void **local_5d8;
  undefined4 local_5cc;
  long local_5c8;
  undefined4 local_5bc;
  long local_5b8;
  int local_550;
  undefined4 local_54c;
  Mat *local_548;
  int local_540;
  undefined4 local_53c;
  Mat *local_538;
  int local_530;
  undefined4 local_52c;
  Mat *local_528;
  int local_520;
  undefined4 local_51c;
  Mat *local_518;
  int local_510;
  undefined4 local_50c;
  Mat *local_508;
  int local_500;
  undefined4 local_4fc;
  Mat *local_4f8;
  int local_4e0;
  undefined4 local_4dc;
  Mat *local_4d8;
  int local_4c0;
  undefined4 local_4bc;
  void **local_4b8;
  int local_4a0;
  undefined4 local_49c;
  Mat *local_498;
  int local_480;
  undefined4 local_47c;
  Mat *local_478;
  undefined8 *local_458;
  undefined8 *local_438;
  int local_420;
  undefined4 local_41c;
  Mat *local_418;
  int local_400;
  undefined4 local_3fc;
  undefined8 *local_3f8;
  int local_3e0;
  undefined4 local_3dc;
  Mat *local_3d8;
  int local_3c0;
  undefined4 local_3bc;
  Mat *local_3b8;
  int local_3a0;
  undefined4 local_39c;
  void **local_398;
  int local_380;
  undefined4 local_37c;
  void **local_378;
  void *local_370;
  void *local_350;
  void *local_340;
  void *local_2f0;
  void *local_2e0;
  void *local_2d0;
  void *local_2c0;
  void *local_2b0;
  void *local_2a8;
  void *local_2a0;
  void *local_298;
  void *local_290;
  void *local_288;
  Mat *local_250;
  Mat *local_248;
  Mat *local_240;
  Mat *local_238;
  Mat *local_230;
  Mat *local_228;
  Allocator *local_220;
  int local_214;
  ulong local_210;
  void *local_208;
  int local_200;
  uint local_1fc;
  int local_1f8;
  int local_1f4;
  undefined1 *local_1f0;
  undefined4 local_1e4;
  long local_1e0;
  Allocator *local_1d8;
  int local_1cc;
  ulong local_1c8;
  void *local_1c0;
  int local_1b8;
  uint local_1b4;
  int local_1b0;
  int local_1ac;
  void **local_1a8;
  undefined4 local_19c;
  long local_198;
  Allocator *local_190;
  int local_184;
  ulong local_180;
  void *local_178;
  int local_16c;
  int local_168;
  int local_164;
  Mat *local_160;
  undefined4 local_154;
  long local_150;
  Allocator *local_148;
  int local_13c;
  size_t local_138;
  void *local_130;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  undefined4 local_10c;
  long local_108;
  Allocator *local_100;
  int local_f4;
  void *local_e8;
  uint local_dc;
  int local_d8;
  int local_d4;
  Mat *local_d0;
  undefined4 local_c4;
  long local_c0;
  Allocator *local_b8;
  int local_ac;
  ulong local_a8;
  void *local_a0;
  uint local_94;
  int local_90;
  int local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  long local_78;
  Allocator *local_70;
  int local_64;
  size_t local_60;
  void *local_58;
  int local_50;
  int local_4c;
  Mat *local_48;
  Allocator *local_40;
  int local_34;
  ulong local_30;
  void *local_28;
  int local_20;
  int local_1c;
  Mat *local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  local_984 = in_RSI->w;
  local_988 = in_RSI->h;
  local_98c = in_RSI->d;
  local_990 = in_RSI->c;
  local_994 = in_RSI->dims;
  local_9a0 = in_RSI->elemsize;
  local_9a4 = in_RSI->elempack;
  local_970 = in_RSI;
  if (local_9a4 != 4) {
LAB_0074c3a1:
    local_690 = &local_d80;
    local_698 = local_970;
    local_d80.data = local_970->data;
    local_d80.refcount = local_970->refcount;
    local_d80.elemsize = local_970->elemsize;
    local_d80.elempack = local_970->elempack;
    local_d80.allocator = local_970->allocator;
    local_d80.dims = local_970->dims;
    local_d80.w = local_970->w;
    local_d80.h = local_970->h;
    local_d80.d = local_970->d;
    local_d80.c = local_970->c;
    local_d80.cstep = local_970->cstep;
    if (local_d80.refcount != (int *)0x0) {
      local_c = 1;
      LOCK();
      local_10 = *local_d80.refcount;
      *local_d80.refcount = *local_d80.refcount + 1;
      UNLOCK();
    }
    local_8 = local_690;
    if (local_9a4 != 1) {
      convert_packing(local_690,local_690,in_stack_ffffffffffffefa4,
                      (Option *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    }
    local_95c = Crop::forward(in_stack_fffffffffffff580,in_stack_fffffffffffff578,
                              in_stack_fffffffffffff570,in_stack_fffffffffffff568);
    local_adc = 1;
    pMVar10 = &local_d80;
    if (local_d80.refcount != (int *)0x0) {
      local_4dc = 0xffffffff;
      LOCK();
      local_4e0 = *local_d80.refcount;
      *local_d80.refcount = *local_d80.refcount + -1;
      UNLOCK();
      if (local_4e0 == 1) {
        local_898 = pMVar10;
        local_4d8 = pMVar10;
        if (local_d80.allocator == (Allocator *)0x0) {
          local_2c0 = local_d80.data;
          if (local_d80.data != (void *)0x0) {
            free(local_d80.data);
          }
        }
        else {
          (*(local_d80.allocator)->_vptr_Allocator[3])(local_d80.allocator,local_d80.data);
        }
      }
    }
    pMVar10->data = (void *)0x0;
    pMVar10->elemsize = 0;
    pMVar10->elempack = 0;
    pMVar10->dims = 0;
    pMVar10->w = 0;
    pMVar10->h = 0;
    pMVar10->d = 0;
    pMVar10->c = 0;
    pMVar10->cstep = 0;
    pMVar10->refcount = (int *)0x0;
    return local_95c;
  }
  local_950 = &local_a10;
  if (in_RSI->dims == 1) {
    local_66c = in_RSI->w * in_RSI->elempack;
    local_668 = &local_a10;
    local_678 = 0;
    local_680 = 4;
    local_688 = 0;
    local_a00 = 4;
    local_9f8 = 1;
    local_9e8 = 1;
    local_9e0 = 1;
    local_9dc = 1;
    local_9d8 = 1;
    local_9d0 = (ulong)local_66c;
    local_9e4 = local_66c;
  }
  else if (in_RSI->dims == 2) {
    local_644 = in_RSI->w;
    local_648 = in_RSI->h * in_RSI->elempack;
    local_640 = &local_a10;
    local_650 = 0;
    local_658 = 4;
    local_660 = 0;
    local_a00 = 4;
    local_9f8 = 1;
    local_9e8 = 2;
    local_9dc = 1;
    local_9d8 = 1;
    local_9d0 = (long)local_644 * (long)local_648;
    local_9e4 = local_644;
    local_9e0 = local_648;
  }
  else if (in_RSI->dims == 3) {
    local_614 = in_RSI->w;
    local_618 = in_RSI->h;
    local_61c = in_RSI->c * in_RSI->elempack;
    local_610 = &local_a10;
    local_628 = 0;
    local_630 = 4;
    local_638 = 0;
    local_a00 = 4;
    local_9f8 = 1;
    local_9e8 = 3;
    local_9dc = 1;
    local_5b8 = (long)local_614 * (long)local_618 * 4;
    local_5bc = 0x10;
    local_9d0 = (local_5b8 + 0xfU & 0xfffffffffffffff0) / 4;
    local_9e4 = local_614;
    local_9e0 = local_618;
    local_9d8 = local_61c;
  }
  else if (in_RSI->dims == 4) {
    local_5e4 = in_RSI->w;
    local_5e8 = in_RSI->h;
    local_5ec = in_RSI->d;
    local_5f0 = in_RSI->c * in_RSI->elempack;
    local_5e0 = &local_a10;
    local_5f8 = 0;
    local_600 = 4;
    local_608 = 0;
    local_a00 = 4;
    local_9f8 = 1;
    local_9e8 = 4;
    local_5c8 = (long)local_5e4 * (long)local_5e8 * (long)local_5ec * 4;
    local_5cc = 0x10;
    local_9d0 = (local_5c8 + 0xfU & 0xfffffffffffffff0) / 4;
    local_9e4 = local_5e4;
    local_9e0 = local_5e8;
    local_9dc = local_5ec;
    local_9d8 = local_5f0;
  }
  else {
    local_5d8 = &local_a10;
    local_a00 = 0;
    local_9f8 = 0;
    local_9e8 = 0;
    local_9e4 = 0;
    local_9e0 = 0;
    local_9dc = 0;
    local_9d8 = 0;
    local_9d0 = 0;
  }
  local_9f0 = (long *)0x0;
  local_a08 = (int *)0x0;
  local_a10 = (void *)0x0;
  _allocator = &local_9c4;
  _elemsize = (undefined1 *)((long)&local_9c4._vptr_Allocator + 4);
  local_978 = in_RDX;
  Crop::resolve_crop_roi
            (in_stack_fffffffffffff088,in_stack_fffffffffffff080,
             (int *)CONCAT17(in_stack_fffffffffffff07f,in_stack_fffffffffffff078),
             in_stack_fffffffffffff070,
             (int *)CONCAT17(in_stack_fffffffffffff06f,in_stack_fffffffffffff068),
             in_stack_fffffffffffff060,in_stack_fffffffffffff0d0,in_stack_fffffffffffff0d8,
             in_stack_fffffffffffff0e0,in_stack_fffffffffffff0e8);
  local_948 = &local_a10;
  local_378 = local_948;
  if (local_a08 != (int *)0x0) {
    local_37c = 0xffffffff;
    LOCK();
    local_380 = *local_a08;
    *local_a08 = *local_a08 + -1;
    UNLOCK();
    if (local_380 == 1) {
      if (local_9f0 == (long *)0x0) {
        local_370 = local_a10;
        if (local_a10 != (void *)0x0) {
          free(local_a10);
        }
      }
      else {
        (**(code **)(*local_9f0 + 0x18))(local_9f0,local_a10);
      }
    }
  }
  local_a10 = (void *)0x0;
  local_a00 = 0;
  local_9f8 = 0;
  local_9e8 = 0;
  local_9e4 = 0;
  local_9e0 = 0;
  local_9dc = 0;
  local_9d8 = 0;
  local_9d0 = 0;
  local_a08 = (int *)0x0;
  if (local_994 == 1) {
    iVar7 = 1;
    if (local_9b8 % 4 == 0) {
      iVar7 = 4;
    }
    if ((local_9b8 / iVar7 == local_984) && (iVar7 == 4)) {
      local_7d8 = local_978;
      local_7e0 = local_970;
      if (local_978 != local_970) {
        if (local_970->refcount != (int *)0x0) {
          piVar13 = local_970->refcount;
          local_7e4 = 1;
          LOCK();
          local_7e8 = *piVar13;
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        local_548 = local_978;
        if (local_978->refcount != (int *)0x0) {
          piVar13 = local_978->refcount;
          local_54c = 0xffffffff;
          LOCK();
          local_550 = *piVar13;
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (local_550 == 1) {
            if (local_978->allocator == (Allocator *)0x0) {
              local_288 = local_978->data;
              if (local_288 != (void *)0x0) {
                free(local_288);
              }
            }
            else {
              (*local_978->allocator->_vptr_Allocator[3])
                        (local_978->allocator,local_978->data,
                         (long)local_9b8 % (long)iVar7 & 0xffffffff);
            }
          }
        }
        local_978->data = (void *)0x0;
        local_978->elemsize = 0;
        local_978->elempack = 0;
        local_978->dims = 0;
        local_978->w = 0;
        local_978->h = 0;
        local_978->d = 0;
        local_978->c = 0;
        local_978->cstep = 0;
        local_978->refcount = (int *)0x0;
        local_978->data = local_7e0->data;
        local_978->refcount = local_7e0->refcount;
        local_978->elemsize = local_7e0->elemsize;
        local_978->elempack = local_7e0->elempack;
        local_978->allocator = local_7e0->allocator;
        local_978->dims = local_7e0->dims;
        local_978->w = local_7e0->w;
        local_978->h = local_7e0->h;
        local_978->d = local_7e0->d;
        local_978->c = local_7e0->c;
        local_978->cstep = local_7e0->cstep;
      }
      return 0;
    }
    if ((local_9a8 % 4 == 0) && (iVar7 == 4)) {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                  in_stack_ffffffffffffef9c,(size_t)in_stack_ffffffffffffef90,
                  in_stack_ffffffffffffef8c,_allocator);
      local_7a0 = local_978;
      bVar9 = true;
      if (local_978->data != (void *)0x0) {
        local_250 = local_978;
        bVar9 = local_978->cstep * (long)local_978->c == 0;
      }
      if (!bVar9) {
        crop_pack4_sse(local_970,local_978,0,local_9a8 / local_9a4);
        return 0;
      }
      return -100;
    }
  }
  if (local_994 == 2) {
    iVar7 = 1;
    if (local_9bc % 4 == 0) {
      iVar7 = 4;
    }
    if (((local_9b8 == local_984) && (local_9bc / iVar7 == local_988)) && (iVar7 == 4)) {
      local_7f8 = local_978;
      local_800 = local_970;
      if (local_978 != local_970) {
        if (local_970->refcount != (int *)0x0) {
          piVar13 = local_970->refcount;
          local_804 = 1;
          LOCK();
          local_808 = *piVar13;
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        local_538 = local_978;
        if (local_978->refcount != (int *)0x0) {
          piVar13 = local_978->refcount;
          local_53c = 0xffffffff;
          LOCK();
          local_540 = *piVar13;
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (local_540 == 1) {
            if (local_978->allocator == (Allocator *)0x0) {
              local_290 = local_978->data;
              if (local_290 != (void *)0x0) {
                free(local_290);
              }
            }
            else {
              (*local_978->allocator->_vptr_Allocator[3])
                        (local_978->allocator,local_978->data,
                         (long)local_9bc % (long)iVar7 & 0xffffffff);
            }
          }
        }
        local_978->data = (void *)0x0;
        local_978->elemsize = 0;
        local_978->elempack = 0;
        local_978->dims = 0;
        local_978->w = 0;
        local_978->h = 0;
        local_978->d = 0;
        local_978->c = 0;
        local_978->cstep = 0;
        local_978->refcount = (int *)0x0;
        local_978->data = local_800->data;
        local_978->refcount = local_800->refcount;
        local_978->elemsize = local_800->elemsize;
        local_978->elempack = local_800->elempack;
        local_978->allocator = local_800->allocator;
        local_978->dims = local_800->dims;
        local_978->w = local_800->w;
        local_978->h = local_800->h;
        local_978->d = local_800->d;
        local_978->c = local_800->c;
        local_978->cstep = local_800->cstep;
      }
      return 0;
    }
    if ((local_9ac % 4 == 0) && (iVar7 == 4)) {
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                  in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98,
                  (size_t)in_stack_ffffffffffffef90,in_stack_ffffffffffffef8c,_allocator);
      local_7a8 = local_978;
      bVar9 = true;
      if (local_978->data != (void *)0x0) {
        local_248 = local_978;
        bVar9 = local_978->cstep * (long)local_978->c == 0;
      }
      if (!bVar9) {
        crop_pack4_sse(local_970,local_978,local_9ac / local_9a4,local_9a8);
        return 0;
      }
      return -100;
    }
  }
  if (local_994 == 3) {
    iVar7 = 1;
    if ((int)local_9c4._vptr_Allocator % 4 == 0) {
      iVar7 = 4;
    }
    if (((local_9b8 == local_984) && (local_9bc == local_988)) &&
       (((int)local_9c4._vptr_Allocator / iVar7 == local_990 && (iVar7 == 4)))) {
      local_818 = local_978;
      local_820 = local_970;
      if (local_978 != local_970) {
        if (local_970->refcount != (int *)0x0) {
          piVar13 = local_970->refcount;
          local_824 = 1;
          LOCK();
          local_828 = *piVar13;
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        local_528 = local_978;
        if (local_978->refcount != (int *)0x0) {
          piVar13 = local_978->refcount;
          local_52c = 0xffffffff;
          LOCK();
          local_530 = *piVar13;
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (local_530 == 1) {
            if (local_978->allocator == (Allocator *)0x0) {
              local_298 = local_978->data;
              if (local_298 != (void *)0x0) {
                free(local_298);
              }
            }
            else {
              (*local_978->allocator->_vptr_Allocator[3])
                        (local_978->allocator,local_978->data,
                         (long)(int)local_9c4._vptr_Allocator % (long)iVar7 & 0xffffffff);
            }
          }
        }
        local_978->data = (void *)0x0;
        local_978->elemsize = 0;
        local_978->elempack = 0;
        local_978->dims = 0;
        local_978->w = 0;
        local_978->h = 0;
        local_978->d = 0;
        local_978->c = 0;
        local_978->cstep = 0;
        local_978->refcount = (int *)0x0;
        local_978->data = local_820->data;
        local_978->refcount = local_820->refcount;
        local_978->elemsize = local_820->elemsize;
        local_978->elempack = local_820->elempack;
        local_978->allocator = local_820->allocator;
        local_978->dims = local_820->dims;
        local_978->w = local_820->w;
        local_978->h = local_820->h;
        local_978->d = local_820->d;
        local_978->c = local_820->c;
        local_978->cstep = local_820->cstep;
      }
      return 0;
    }
    if ((local_9b4 % 4 == 0) && (iVar7 == 4)) {
      local_764 = local_9b4 / 4;
      local_768 = (int)local_9c4._vptr_Allocator / 4;
      local_758 = &stack0xfffffffffffff570;
      iVar7 = local_970->w;
      iVar1 = local_970->h;
      uVar2 = local_970->d;
      __ptr = (void *)((long)local_970->data +
                      local_970->cstep * (long)local_764 * local_970->elemsize);
      uVar14 = local_970->elemsize;
      iVar3 = local_970->elempack;
      pAVar5 = local_970->allocator;
      local_1f0 = &stack0xfffffffffffff570;
      local_1e0 = (long)iVar7 * (long)iVar1 * (long)(int)uVar2 * uVar14;
      uVar8 = (local_1e0 + 0xfU & 0xfffffffffffffff0) / uVar14;
      iVar4 = local_970->dims;
      local_1e4 = 0x10;
      local_769 = 1;
      piVar13 = (int *)0x0;
      local_220 = pAVar5;
      local_214 = iVar3;
      local_210 = uVar14;
      local_208 = __ptr;
      local_200 = local_768;
      local_1fc = uVar2;
      local_1f8 = iVar1;
      local_1f4 = iVar7;
      if ((local_9b8 == local_984) && (local_9bc == local_988)) {
        Mat::clone((Mat *)&local_ad8,(__fn *)&stack0xfffffffffffff570,(void *)0x0,(int)local_1f0,
                   (void *)(ulong)uVar2);
        pMVar10 = local_978;
        local_838 = local_978;
        local_840 = (Mat *)&local_ad8;
        if (local_978 != local_840) {
          if (local_ad0 != (int *)0x0) {
            local_844 = 1;
            LOCK();
            local_848 = *local_ad0;
            *local_ad0 = *local_ad0 + 1;
            UNLOCK();
          }
          local_518 = local_978;
          if (local_978->refcount != (int *)0x0) {
            piVar6 = local_978->refcount;
            local_51c = 0xffffffff;
            LOCK();
            local_520 = *piVar6;
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (local_520 == 1) {
              if (local_978->allocator == (Allocator *)0x0) {
                local_2a0 = local_978->data;
                if (local_2a0 != (void *)0x0) {
                  free(local_2a0);
                }
              }
              else {
                (*local_978->allocator->_vptr_Allocator[3])(local_978->allocator,local_978->data);
              }
            }
          }
          pMVar10->data = (void *)0x0;
          pMVar10->elemsize = 0;
          pMVar10->elempack = 0;
          pMVar10->dims = 0;
          pMVar10->w = 0;
          pMVar10->h = 0;
          pMVar10->d = 0;
          pMVar10->c = 0;
          pMVar10->cstep = 0;
          pMVar10->refcount = (int *)0x0;
          pMVar10->data = local_840->data;
          pMVar10->refcount = local_840->refcount;
          pMVar10->elemsize = local_840->elemsize;
          pMVar10->elempack = local_840->elempack;
          pMVar10->allocator = local_840->allocator;
          pMVar10->dims = local_840->dims;
          pMVar10->w = local_840->w;
          pMVar10->h = local_840->h;
          pMVar10->d = local_840->d;
          pMVar10->c = local_840->c;
          pMVar10->cstep = local_840->cstep;
        }
        local_938 = &local_ad8;
        local_398 = local_938;
        if (local_ad0 != (int *)0x0) {
          local_39c = 0xffffffff;
          LOCK();
          local_3a0 = *local_ad0;
          *local_ad0 = *local_ad0 + -1;
          UNLOCK();
          if (local_3a0 == 1) {
            if (local_ab8 == (Allocator *)0x0) {
              if (local_ad8 != (void *)0x0) {
                free(local_ad8);
              }
            }
            else {
              (*local_ab8->_vptr_Allocator[3])(local_ab8,local_ad8);
            }
          }
        }
        local_ad8 = (void *)0x0;
        local_ac8 = 0;
        local_ac0 = 0;
        local_ab0 = 0;
        local_aac = 0;
        local_aa8 = 0;
        local_aa4 = 0;
        local_aa0 = 0;
        local_ad0 = (int *)0x0;
        local_7b0 = local_978;
        bVar9 = true;
        if (local_978->data != (void *)0x0) {
          local_240 = local_978;
          bVar9 = local_978->cstep * (long)local_978->c == 0;
        }
        if (bVar9) {
          local_95c = -100;
          goto LAB_0074a279;
        }
      }
      Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                  in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98,
                  (int)((ulong)in_stack_ffffffffffffef90 >> 0x20),
                  CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                  (int)((ulong)_allocator >> 0x20),in_stack_fffffffffffff000);
      local_7b8 = local_978;
      bVar9 = true;
      if (local_978->data != (void *)0x0) {
        local_238 = local_978;
        bVar9 = local_978->cstep * (long)local_978->c == 0;
      }
      if (bVar9) {
        local_95c = -100;
      }
      else {
        for (local_ae0 = 0; local_ae0 < local_978->c; local_ae0 = local_ae0 + 1) {
          local_718 = &local_b28;
          local_720 = &stack0xfffffffffffff570;
          local_e8 = (void *)((long)__ptr + uVar8 * (long)local_ae0 * uVar14);
          local_d0 = &local_b28;
          local_b28.refcount = (int *)0x0;
          local_b28.d = 1;
          local_c0 = (long)iVar7 * (long)iVar1 * uVar14;
          local_b28.cstep = (local_c0 + 0xfU & 0xfffffffffffffff0) / uVar14;
          local_b28.dims = iVar4 + -1;
          if (iVar4 == 4) {
            local_b28.cstep = (long)iVar7 * (long)iVar1;
          }
          local_6d8 = &local_b70;
          local_164 = local_978->w;
          local_168 = local_978->h;
          local_16c = local_978->d;
          local_178 = (void *)((long)local_978->data +
                              local_978->cstep * (long)local_ae0 * local_978->elemsize);
          local_180 = local_978->elemsize;
          local_184 = local_978->elempack;
          local_190 = local_978->allocator;
          local_160 = &local_b70;
          local_b70.refcount = (int *)0x0;
          local_b70.d = 1;
          local_150 = (long)local_164 * (long)local_168 * local_180;
          local_b70.cstep = (local_150 + 0xfU & 0xfffffffffffffff0) / local_180;
          local_b70.dims = local_978->dims + -1;
          if (local_978->dims == 4) {
            local_b70.cstep = (long)local_978->w * (long)local_978->h;
          }
          local_c4 = 0x10;
          local_154 = 0x10;
          local_6e4 = local_ae0;
          local_6e5 = 1;
          local_724 = local_ae0;
          local_725 = 1;
          local_100 = pAVar5;
          local_f4 = iVar3;
          local_dc = uVar2;
          local_d8 = iVar1;
          local_d4 = iVar7;
          local_b70.data = local_178;
          local_b70.elemsize = local_180;
          local_b70.elempack = local_184;
          local_b70.allocator = local_190;
          local_b70.w = local_164;
          local_b70.h = local_168;
          local_b70.c = local_16c;
          local_b28.data = local_e8;
          local_b28.elemsize = uVar14;
          local_b28.elempack = iVar3;
          local_b28.allocator = pAVar5;
          local_b28.w = iVar7;
          local_b28.h = iVar1;
          local_b28.c = uVar2;
          crop_pack4_sse(&local_b28,&local_b70,local_9ac,local_9a8);
          local_928 = &local_b70;
          local_3b8 = local_928;
          if (local_b70.refcount != (int *)0x0) {
            local_3bc = 0xffffffff;
            LOCK();
            local_3c0 = *local_b70.refcount;
            *local_b70.refcount = *local_b70.refcount + -1;
            UNLOCK();
            if (local_3c0 == 1) {
              if (local_b70.allocator == (Allocator *)0x0) {
                local_350 = local_b70.data;
                if (local_b70.data != (void *)0x0) {
                  free(local_b70.data);
                }
              }
              else {
                (*(local_b70.allocator)->_vptr_Allocator[3])(local_b70.allocator,local_b70.data);
              }
            }
          }
          local_b70.data = (void *)0x0;
          local_b70.elemsize = 0;
          local_b70.elempack = 0;
          local_b70.dims = 0;
          local_b70.w = 0;
          local_b70.h = 0;
          local_b70.d = 0;
          local_b70.c = 0;
          local_b70.cstep = 0;
          local_b70.refcount = (int *)0x0;
          pMVar10 = &local_b28;
          local_918 = pMVar10;
          local_3d8 = pMVar10;
          if (local_b28.refcount != (int *)0x0) {
            local_3dc = 0xffffffff;
            LOCK();
            local_3e0 = *local_b28.refcount;
            *local_b28.refcount = *local_b28.refcount + -1;
            UNLOCK();
            if (local_3e0 == 1) {
              if (local_b28.allocator == (Allocator *)0x0) {
                local_340 = local_b28.data;
                if (local_b28.data != (void *)0x0) {
                  free(local_b28.data);
                }
              }
              else {
                (*(local_b28.allocator)->_vptr_Allocator[3])(local_b28.allocator,local_b28.data);
              }
            }
          }
          pMVar10->data = (void *)0x0;
          pMVar10->elemsize = 0;
          pMVar10->elempack = 0;
          pMVar10->dims = 0;
          pMVar10->w = 0;
          pMVar10->h = 0;
          pMVar10->d = 0;
          pMVar10->c = 0;
          pMVar10->cstep = 0;
          pMVar10->refcount = (int *)0x0;
        }
        local_95c = 0;
      }
LAB_0074a279:
      local_adc = 1;
      puVar12 = (undefined8 *)&stack0xfffffffffffff570;
      if (piVar13 != (int *)0x0) {
        local_3fc = 0xffffffff;
        LOCK();
        local_400 = *piVar13;
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (local_400 == 1) {
          local_908 = puVar12;
          local_3f8 = puVar12;
          if (pAVar5 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])(pAVar5,__ptr);
          }
        }
      }
      *puVar12 = 0;
      puVar12[2] = 0;
      *(undefined4 *)(puVar12 + 3) = 0;
      *(undefined4 *)(puVar12 + 5) = 0;
      *(undefined4 *)((long)puVar12 + 0x2c) = 0;
      *(undefined4 *)(puVar12 + 6) = 0;
      *(undefined4 *)((long)puVar12 + 0x34) = 0;
      *(undefined4 *)(puVar12 + 7) = 0;
      puVar12[8] = 0;
      puVar12[1] = 0;
      return local_95c;
    }
  }
  if (local_994 != 4) goto LAB_0074c3a1;
  local_b74 = 1;
  if ((int)local_9c4._vptr_Allocator % 4 == 0) {
    local_b74 = 4;
  }
  local_b80 = (local_9a0 / (ulong)(long)local_9a4) * (long)local_b74;
  if ((((local_9b8 == local_984) && (local_9bc == local_988)) &&
      (local_9c4._vptr_Allocator._4_4_ == local_98c)) &&
     (((int)local_9c4._vptr_Allocator / local_b74 == local_990 && (local_b74 == 4)))) {
    local_858 = local_978;
    local_860 = local_970;
    if (local_978 != local_970) {
      if (local_970->refcount != (int *)0x0) {
        piVar13 = local_970->refcount;
        local_864 = 1;
        LOCK();
        local_868 = *piVar13;
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      local_508 = local_978;
      if (local_978->refcount != (int *)0x0) {
        piVar13 = local_978->refcount;
        local_50c = 0xffffffff;
        LOCK();
        local_510 = *piVar13;
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (local_510 == 1) {
          if (local_978->allocator == (Allocator *)0x0) {
            local_2a8 = local_978->data;
            if (local_2a8 != (void *)0x0) {
              free(local_2a8);
            }
          }
          else {
            (*local_978->allocator->_vptr_Allocator[3])
                      (local_978->allocator,local_978->data,
                       (long)(int)local_9c4._vptr_Allocator % (long)local_b74 & 0xffffffff);
          }
        }
      }
      local_978->data = (void *)0x0;
      local_978->elemsize = 0;
      local_978->elempack = 0;
      local_978->dims = 0;
      local_978->w = 0;
      local_978->h = 0;
      local_978->d = 0;
      local_978->c = 0;
      local_978->cstep = 0;
      local_978->refcount = (int *)0x0;
      local_978->data = local_860->data;
      local_978->refcount = local_860->refcount;
      local_978->elemsize = local_860->elemsize;
      local_978->elempack = local_860->elempack;
      local_978->allocator = local_860->allocator;
      local_978->dims = local_860->dims;
      local_978->w = local_860->w;
      local_978->h = local_860->h;
      local_978->d = local_860->d;
      local_978->c = local_860->c;
      local_978->cstep = local_860->cstep;
    }
    return 0;
  }
  if ((local_9b4 % 4 != 0) || (local_b74 != 4)) goto LAB_0074c3a1;
  local_78c = local_9b4 / 4;
  local_790 = (int)local_9c4._vptr_Allocator / 4;
  local_780 = &local_bc8;
  local_1ac = local_970->w;
  local_1b0 = local_970->h;
  local_1b4 = local_970->d;
  local_1c0 = (void *)((long)local_970->data +
                      local_970->cstep * (long)local_78c * local_970->elemsize);
  local_1c8 = local_970->elemsize;
  local_1cc = local_970->elempack;
  local_1d8 = local_970->allocator;
  local_1a8 = &local_bc8;
  local_bc0 = (int *)0x0;
  local_198 = (long)local_1ac * (long)local_1b0 * (long)(int)local_1b4 * local_1c8;
  local_b88 = (local_198 + 0xfU & 0xfffffffffffffff0) / local_1c8;
  local_ba0 = local_970->dims;
  local_19c = 0x10;
  local_791 = 1;
  local_1b8 = local_790;
  local_bc8 = local_1c0;
  local_bb8 = local_1c8;
  local_bb0 = local_1cc;
  local_ba8 = local_1d8;
  local_b9c = local_1ac;
  local_b98 = local_1b0;
  local_b94 = local_1b4;
  local_b90 = local_790;
  if (((local_9b8 == local_984) && (local_9bc == local_988)) &&
     (local_9c4._vptr_Allocator._4_4_ == local_98c)) {
    Mat::clone(&local_c10,(__fn *)&local_bc8,(void *)0x0,(int)local_1a8,(void *)(ulong)local_1b4);
    pMVar10 = local_978;
    local_878 = local_978;
    local_880 = &local_c10;
    if (local_978 != local_880) {
      if (local_c10.refcount != (int *)0x0) {
        local_884 = 1;
        LOCK();
        local_888 = *local_c10.refcount;
        *local_c10.refcount = *local_c10.refcount + 1;
        UNLOCK();
      }
      local_4f8 = local_978;
      pMVar11 = local_978;
      if (local_978->refcount != (int *)0x0) {
        piVar13 = local_978->refcount;
        local_4fc = 0xffffffff;
        LOCK();
        local_500 = *piVar13;
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (local_500 == 1) {
          if (local_978->allocator == (Allocator *)0x0) {
            local_2b0 = local_978->data;
            if (local_2b0 != (void *)0x0) {
              free(local_2b0);
            }
          }
          else {
            (*local_978->allocator->_vptr_Allocator[3])(local_978->allocator,local_978->data);
          }
        }
      }
      pMVar11->data = (void *)0x0;
      pMVar11->elemsize = 0;
      pMVar11->elempack = 0;
      pMVar11->dims = 0;
      pMVar11->w = 0;
      pMVar11->h = 0;
      pMVar11->d = 0;
      pMVar11->c = 0;
      pMVar11->cstep = 0;
      pMVar11->refcount = (int *)0x0;
      pMVar10->data = local_880->data;
      pMVar10->refcount = local_880->refcount;
      pMVar10->elemsize = local_880->elemsize;
      pMVar10->elempack = local_880->elempack;
      pMVar10->allocator = local_880->allocator;
      pMVar10->dims = local_880->dims;
      pMVar10->w = local_880->w;
      pMVar10->h = local_880->h;
      pMVar10->d = local_880->d;
      pMVar10->c = local_880->c;
      pMVar10->cstep = local_880->cstep;
    }
    pMVar10 = &local_c10;
    local_8f8 = pMVar10;
    local_418 = pMVar10;
    if (local_c10.refcount != (int *)0x0) {
      local_41c = 0xffffffff;
      LOCK();
      local_420 = *local_c10.refcount;
      *local_c10.refcount = *local_c10.refcount + -1;
      UNLOCK();
      if (local_420 == 1) {
        if (local_c10.allocator == (Allocator *)0x0) {
          if (local_c10.data != (void *)0x0) {
            free(local_c10.data);
          }
        }
        else {
          (*(local_c10.allocator)->_vptr_Allocator[3])(local_c10.allocator,local_c10.data);
        }
      }
    }
    pMVar10->data = (void *)0x0;
    pMVar10->elemsize = 0;
    pMVar10->elempack = 0;
    pMVar10->dims = 0;
    pMVar10->w = 0;
    pMVar10->h = 0;
    pMVar10->d = 0;
    pMVar10->c = 0;
    pMVar10->cstep = 0;
    pMVar10->refcount = (int *)0x0;
    local_7c0 = local_978;
    bVar9 = true;
    if (local_978->data != (void *)0x0) {
      local_230 = local_978;
      bVar9 = local_978->cstep * (long)local_978->c == 0;
    }
    if (bVar9) {
      local_95c = -100;
      goto LAB_0074c171;
    }
  }
  Mat::create(in_stack_ffffffffffffef90,in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88,
              (int)((ulong)_allocator >> 0x20),(int)_allocator,(size_t)_elemsize,
              in_stack_ffffffffffffeff0,in_stack_ffffffffffffeff8);
  local_7c8 = local_978;
  bVar9 = true;
  if (local_978->data != (void *)0x0) {
    local_228 = local_978;
    bVar9 = local_978->cstep * (long)local_978->c == 0;
  }
  if (bVar9) {
    local_95c = -100;
  }
  else {
    for (local_c14 = 0; local_c14 < local_978->c; local_c14 = local_c14 + 1) {
      for (local_c18 = 0; local_c18 < local_9c4._vptr_Allocator._4_4_; local_c18 = local_c18 + 1) {
        local_738 = &local_ca8;
        local_740 = &local_bc8;
        local_a0 = (void *)((long)local_bc8 + local_b88 * (long)local_c14 * local_bb8);
        local_88 = &local_ca8;
        local_78 = (long)local_b9c * (long)local_b98 * local_bb8;
        local_6c4 = local_c18 + local_9b0;
        local_6b8 = &local_c60;
        local_6c0 = &local_ca8;
        local_28 = (void *)((long)local_a0 +
                           (long)local_b9c * (long)local_b98 * (long)local_6c4 * local_bb8);
        local_18 = &local_c60;
        local_c60.cstep = (long)local_b9c * (long)local_b98;
        local_8e8 = &local_ca8;
        local_6f8 = &local_d38;
        local_11c = local_978->w;
        local_120 = local_978->h;
        local_124 = local_978->d;
        local_130 = (void *)((long)local_978->data +
                            local_978->cstep * (long)local_c14 * local_978->elemsize);
        local_138 = local_978->elemsize;
        local_13c = local_978->elempack;
        local_148 = local_978->allocator;
        local_118 = &local_d38;
        local_108 = (long)local_11c * (long)local_120 * local_138;
        local_6a0 = &local_cf0;
        local_6a8 = &local_d38;
        local_58 = (void *)((long)local_130 +
                           (long)local_11c * (long)local_120 * (long)local_c18 * local_138);
        local_48 = &local_cf0;
        local_cf0.cstep = (long)local_11c * (long)local_120;
        local_8d8 = &local_d38;
        local_c60.c = 1;
        local_c60.d = 1;
        local_c60.h = local_b98;
        local_c60.w = local_b9c;
        local_c60.dims = 2;
        local_c60.allocator = local_ba8;
        local_c60.elempack = local_bb0;
        local_c60.elemsize = local_bb8;
        local_c60.refcount = (int *)0x0;
        local_c70 = 0;
        local_c74 = 0;
        local_c78 = 0;
        local_c7c = 0;
        local_c88 = local_ba8;
        local_c90 = 0;
        local_c98 = 0;
        local_ca0 = 0;
        local_ca8 = 0;
        local_cf0.c = 1;
        local_cf0.d = 1;
        local_cf0.dims = 2;
        local_cf0.refcount = (int *)0x0;
        local_1c = local_b9c;
        local_20 = local_b98;
        local_30 = local_bb8;
        local_34 = local_bb0;
        local_40 = local_ba8;
        local_7c = 0x10;
        local_8c = local_b9c;
        local_90 = local_b98;
        local_94 = local_b94;
        local_a8 = local_bb8;
        local_ac = local_bb0;
        local_b8 = local_ba8;
        local_10c = 0x10;
        local_6ac = local_c18;
        local_704 = local_c14;
        local_705 = 1;
        local_744 = local_c14;
        local_745 = 1;
        local_c68 = 0;
        local_c80 = 0;
        local_d38 = 0;
        local_d28 = 0;
        local_d20 = 0;
        local_d10 = 0;
        local_d0c = 0;
        local_d08 = 0;
        local_d04 = 0;
        local_d00 = 0;
        local_cf8 = 0;
        local_d30 = 0;
        local_458 = local_8d8;
        local_438 = local_8e8;
        local_70 = local_148;
        local_64 = local_13c;
        local_60 = local_138;
        local_50 = local_120;
        local_4c = local_11c;
        local_d18 = local_148;
        local_cf0.data = local_58;
        local_cf0.elemsize = local_138;
        local_cf0.elempack = local_13c;
        local_cf0.allocator = local_148;
        local_cf0.w = local_11c;
        local_cf0.h = local_120;
        local_c60.data = local_28;
        crop_pack4_sse(&local_c60,&local_cf0,local_9ac,local_9a8);
        local_8c8 = &local_cf0;
        local_478 = local_8c8;
        if (local_cf0.refcount != (int *)0x0) {
          local_47c = 0xffffffff;
          LOCK();
          local_480 = *local_cf0.refcount;
          *local_cf0.refcount = *local_cf0.refcount + -1;
          UNLOCK();
          if (local_480 == 1) {
            if (local_cf0.allocator == (Allocator *)0x0) {
              local_2f0 = local_cf0.data;
              if (local_cf0.data != (void *)0x0) {
                free(local_cf0.data);
              }
            }
            else {
              (*(local_cf0.allocator)->_vptr_Allocator[3])(local_cf0.allocator,local_cf0.data);
            }
          }
        }
        local_cf0.data = (void *)0x0;
        local_cf0.elemsize = 0;
        local_cf0.elempack = 0;
        local_cf0.dims = 0;
        local_cf0.w = 0;
        local_cf0.h = 0;
        local_cf0.d = 0;
        local_cf0.c = 0;
        local_cf0.cstep = 0;
        local_cf0.refcount = (int *)0x0;
        local_8b8 = &local_c60;
        local_498 = local_8b8;
        if (local_c60.refcount != (int *)0x0) {
          local_49c = 0xffffffff;
          LOCK();
          local_4a0 = *local_c60.refcount;
          *local_c60.refcount = *local_c60.refcount + -1;
          UNLOCK();
          if (local_4a0 == 1) {
            if (local_c60.allocator == (Allocator *)0x0) {
              local_2e0 = local_c60.data;
              if (local_c60.data != (void *)0x0) {
                free(local_c60.data);
              }
            }
            else {
              (*(local_c60.allocator)->_vptr_Allocator[3])(local_c60.allocator,local_c60.data);
            }
          }
        }
        local_c60.data = (void *)0x0;
        local_c60.elemsize = 0;
        local_c60.elempack = 0;
        local_c60.dims = 0;
        local_c60.w = 0;
        local_c60.h = 0;
        local_c60.d = 0;
        local_c60.c = 0;
        local_c60.cstep = 0;
        local_c60.refcount = (int *)0x0;
      }
    }
    local_95c = 0;
  }
LAB_0074c171:
  local_adc = 1;
  local_8a8 = &local_bc8;
  if (local_bc0 == (int *)0x0) {
    return local_95c;
  }
  local_4bc = 0xffffffff;
  LOCK();
  local_4c0 = *local_bc0;
  *local_bc0 = *local_bc0 + -1;
  UNLOCK();
  if (local_4c0 != 1) {
    return local_95c;
  }
  local_4b8 = local_8a8;
  if (local_ba8 != (Allocator *)0x0) {
    (*local_ba8->_vptr_Allocator[3])(local_ba8,local_bc8);
    return local_95c;
  }
  local_2d0 = local_bc8;
  if (local_bc8 == (void *)0x0) {
    return local_95c;
  }
  free(local_bc8);
  return local_95c;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}